

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O1

bool __thiscall miniros::ServiceManager::isServiceAdvertised(ServiceManager *this,string *serv_name)

{
  pointer __s2;
  size_t sVar1;
  size_t sVar2;
  size_t __n;
  int iVar3;
  ServiceManager *pSVar4;
  bool bVar5;
  
  pSVar4 = (ServiceManager *)
           (this->service_publications_).
           super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  bVar5 = pSVar4 != this;
  if (bVar5) {
    __s2 = (serv_name->_M_dataplus)._M_p;
    sVar1 = serv_name->_M_string_length;
    do {
      sVar2 = (pSVar4->service_publications_).
              super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
              ._M_impl._M_node._M_size;
      __n = *(size_t *)(sVar2 + 0x18);
      if ((__n == sVar1) &&
         (((__n == 0 || (iVar3 = bcmp(*(void **)(sVar2 + 0x10),__s2,__n), iVar3 == 0)) &&
          (*(char *)(sVar2 + 0x100) != '\x01')))) {
        return bVar5;
      }
      pSVar4 = (ServiceManager *)
               (pSVar4->service_publications_).
               super__List_base<std::shared_ptr<miniros::ServicePublication>,_std::allocator<std::shared_ptr<miniros::ServicePublication>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      bVar5 = pSVar4 != this;
    } while (bVar5);
  }
  return bVar5;
}

Assistant:

bool ServiceManager::isServiceAdvertised(const string& serv_name)
{
  for (auto & pub : service_publications_)
  {
    if (pub->getName() == serv_name && !pub->isDropped())
      return true;
  }

  return false;
}